

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::JunitReporter::EndTestCase
          (JunitReporter *this,TestCaseInfo *param_1,Totals *param_2,string *stdOut,string *stdErr)

{
  pointer *pppTVar1;
  pointer pTVar2;
  ostream *poVar3;
  
  pppTVar1 = &(this->m_currentTestCaseStats).
              super__Vector_base<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  *pppTVar1 = *pppTVar1 + -1;
  pTVar2 = (this->m_currentStats->m_testCaseStats).
           super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_assign((string *)&pTVar2[-1].m_stdOut);
  std::__cxx11::string::_M_assign((string *)&pTVar2[-1].m_stdErr);
  if (stdOut->_M_string_length != 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->m_stdOut,(stdOut->_M_dataplus)._M_p,
                        stdOut->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  if (stdErr->_M_string_length != 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->m_stdErr,(stdErr->_M_dataplus)._M_p,
                        stdErr->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    return;
  }
  return;
}

Assistant:

virtual void EndTestCase( const Catch::TestCaseInfo&, const Totals&, const std::string& stdOut, const std::string& stdErr ) {
            m_currentTestCaseStats.pop_back();
            assert( m_currentTestCaseStats.empty() );
            TestCaseStats& testCaseStats = m_currentStats->m_testCaseStats.back();
            testCaseStats.m_stdOut = stdOut;
            testCaseStats.m_stdErr = stdErr;
            if( !stdOut.empty() )
                m_stdOut << stdOut << "\n";
            if( !stdErr.empty() )
                m_stdErr << stdErr << "\n";
        }